

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int inflate_gzip_block(BGZF *fp,int cached)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  z_stream *pzVar4;
  bool bVar5;
  
  pzVar4 = fp->gz_stream;
  if (cached != 0) goto LAB_0012c9c2;
  bVar5 = pzVar4->avail_out == 0;
  do {
    if (!bVar5) {
      sVar2 = hread(fp->fp,fp->compressed_block,0xff00);
      pzVar4 = fp->gz_stream;
      pzVar4->avail_in = (uInt)sVar2;
      if ((uInt)sVar2 == 0) {
        return 0;
      }
      pzVar4->next_in = (Bytef *)fp->compressed_block;
    }
LAB_0012c9c2:
    do {
      iVar1 = fp->block_offset;
      pzVar4->next_out = (Bytef *)((long)iVar1 + (long)fp->uncompressed_block);
      pzVar4->avail_out = 0x10000 - iVar1;
      iVar1 = inflate(pzVar4,0);
      if (iVar1 != -5) {
        if (iVar1 < 0) {
          return -1;
        }
        pzVar4 = fp->gz_stream;
        iVar3 = 0;
        if (pzVar4->avail_out != 0x10000) {
          return 0x10000 - pzVar4->avail_out;
        }
        goto LAB_0012ca0d;
      }
      pzVar4 = fp->gz_stream;
    } while (pzVar4->avail_out == 0);
    iVar3 = 0x10000 - pzVar4->avail_out;
LAB_0012ca0d:
    bVar5 = false;
    if (iVar1 == 1) {
      return iVar3;
    }
  } while( true );
}

Assistant:

static int inflate_gzip_block(BGZF *fp, int cached)
{
    int ret = Z_OK;
    do
    {
        if ( !cached && fp->gz_stream->avail_out!=0 )
        {
            fp->gz_stream->avail_in = hread(fp->fp, fp->compressed_block, BGZF_BLOCK_SIZE);
            if ( fp->gz_stream->avail_in<=0 ) return fp->gz_stream->avail_in;
            if ( fp->gz_stream->avail_in==0 ) break;
            fp->gz_stream->next_in = fp->compressed_block;
        }
        else cached = 0;
        do
        {
            fp->gz_stream->next_out = (Bytef*)fp->uncompressed_block + fp->block_offset;
            fp->gz_stream->avail_out = BGZF_MAX_BLOCK_SIZE - fp->block_offset;
            ret = inflate(fp->gz_stream, Z_NO_FLUSH);
            if ( ret==Z_BUF_ERROR ) continue;   // non-critical error
            if ( ret<0 ) return -1;
            unsigned int have = BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
            if ( have ) return have;
        }
        while ( fp->gz_stream->avail_out == 0 );
    }
    while (ret != Z_STREAM_END);
    return BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
}